

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromDouble(bitwidth_t bits,double value,bool isSigned,bool round)

{
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar1;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  double in_stack_00000080;
  bitwidth_t in_stack_0000008c;
  
  SVar1 = fromIEEE754<double,11,52,1023>
                    (in_stack_0000008c,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  SVar1.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar1.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDouble(bitwidth_t bits, double value, bool isSigned, bool round) {
    return fromIEEE754<double, 11, 52, 1023>(bits, value, isSigned, round);
}